

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreSieve.cpp
# Opt level: O0

void primesieve::PreSieve::preSieve
               (Vector<unsigned_char,_std::allocator<unsigned_char>_> *sieve,uint64_t segmentLow)

{
  ulong uVar1;
  initializer_list<unsigned_char> *piVar2;
  size_type sVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  const_iterator puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long lVar11;
  uint64_t uVar12;
  ulong uVar13;
  uchar *puVar14;
  ulong in_RSI;
  Vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t j;
  Array<unsigned_char,_8UL> primeBits;
  uint8_t *sieveArray;
  uint64_t i_1;
  uint64_t bytesToCopy_1;
  size_t i;
  uint64_t bytesToCopy;
  uint64_t pos3;
  uint64_t pos2;
  uint64_t pos1;
  uint64_t pos0;
  uint64_t offset;
  size_t in_stack_00000210;
  uint8_t *in_stack_00000218;
  uint8_t *in_stack_00000220;
  uint8_t *in_stack_00000228;
  uint8_t *in_stack_00000230;
  uint8_t *in_stack_00000238;
  size_t in_stack_00000350;
  uint8_t *in_stack_00000358;
  uint8_t *in_stack_00000360;
  uint8_t *in_stack_00000368;
  uint8_t *in_stack_00000370;
  uint8_t *in_stack_00000378;
  long local_110;
  Array<unsigned_char,_8UL> local_108;
  uchar *local_100;
  ulong local_f8;
  unsigned_long local_f0;
  unsigned_long local_e8;
  unsigned_long local_e0;
  unsigned_long local_d8;
  unsigned_long local_d0;
  ulong local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  Vector<unsigned_char,_std::allocator<unsigned_char>_> *local_68;
  size_t local_60;
  uchar *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  size_t local_30;
  uchar *local_28;
  uint8_t *local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  uint8_t *local_8;
  
  local_78 = 0;
  local_70 = in_RSI;
  local_68 = in_RDI;
  piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                     ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                      (anonymous_namespace)::preSieveTables,0);
  sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
  uVar13 = local_70;
  local_80 = (in_RSI % (sVar3 * 0x1e)) / 0x1e;
  piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                     ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                      (anonymous_namespace)::preSieveTables,1);
  sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
  uVar1 = local_70;
  local_88 = (uVar13 % (sVar3 * 0x1e)) / 0x1e;
  piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                     ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                      (anonymous_namespace)::preSieveTables,2);
  sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
  uVar13 = local_70;
  local_90 = (uVar1 % (sVar3 * 0x1e)) / 0x1e;
  piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                     ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                      (anonymous_namespace)::preSieveTables,3);
  sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
  local_98 = (uVar13 % (sVar3 * 0x1e)) / 0x1e;
  while (uVar13 = local_78,
        sVar4 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_68),
        uVar13 < sVar4) {
    sVar4 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_68);
    local_a0 = sVar4 - local_78;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,0);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    local_a8 = sVar3 - local_80;
    puVar5 = std::min<unsigned_long>(&local_a0,&local_a8);
    local_a0 = *puVar5;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,1);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    local_b0 = sVar3 - local_88;
    puVar5 = std::min<unsigned_long>(&local_a0,&local_b0);
    local_a0 = *puVar5;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,2);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    local_b8 = sVar3 - local_90;
    puVar5 = std::min<unsigned_long>(&local_a0,&local_b8);
    local_a0 = *puVar5;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,3);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    local_c0 = sVar3 - local_98;
    puVar5 = std::min<unsigned_long>(&local_a0,&local_c0);
    local_a0 = *puVar5;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,0);
    puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
    puVar7 = puVar6 + local_80;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,1);
    puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
    puVar8 = puVar6 + local_88;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,2);
    puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
    puVar9 = puVar6 + local_90;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,3);
    puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
    puVar10 = puVar6 + local_98;
    local_58 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_68,local_78);
    local_60 = local_a0;
    local_50 = puVar10;
    local_48 = puVar9;
    local_40 = puVar8;
    local_38 = puVar7;
    if (((anonymous_namespace)::cpu_supports_avx512_bw & 1) == 0) {
      anon_unknown.dwarf_16ead9::presieve1_x86_sse2(puVar7,puVar8,puVar9,puVar10,local_58,local_a0);
    }
    else {
      anon_unknown.dwarf_16ead9::presieve1_x86_avx512
                (in_stack_00000238,in_stack_00000230,in_stack_00000228,in_stack_00000220,
                 in_stack_00000218,in_stack_00000210);
    }
    uVar1 = local_80;
    local_78 = local_a0 + local_78;
    lVar11 = local_80 + local_a0;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,0);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    uVar13 = local_88;
    local_80 = lVar11 * (ulong)(uVar1 < sVar3);
    lVar11 = local_88 + local_a0;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,1);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    uVar1 = local_90;
    local_88 = lVar11 * (ulong)(uVar13 < sVar3);
    lVar11 = local_90 + local_a0;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,2);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    uVar13 = local_98;
    local_90 = lVar11 * (ulong)(uVar1 < sVar3);
    lVar11 = local_98 + local_a0;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,3);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    local_98 = lVar11 * (ulong)(uVar13 < sVar3);
  }
  for (local_c8 = 4; uVar13 = local_c8,
      sVar4 = Array<std::initializer_list<unsigned_char>,_16UL>::size
                        ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                         (anonymous_namespace)::preSieveTables), uVar1 = local_70, uVar13 < sVar4;
      local_c8 = local_c8 + 4) {
    local_78 = 0;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,local_c8);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    uVar13 = local_70;
    local_80 = (uVar1 % (sVar3 * 0x1e)) / 0x1e;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,local_c8 + 1);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    uVar1 = local_70;
    local_88 = (uVar13 % (sVar3 * 0x1e)) / 0x1e;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,local_c8 + 2);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    uVar13 = local_70;
    local_90 = (uVar1 % (sVar3 * 0x1e)) / 0x1e;
    piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                       ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                        (anonymous_namespace)::preSieveTables,local_c8 + 3);
    sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
    local_98 = (uVar13 % (sVar3 * 0x1e)) / 0x1e;
    while (uVar13 = local_78,
          sVar4 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_68),
          uVar13 < sVar4) {
      sVar4 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_68);
      local_d0 = sVar4 - local_78;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      local_d8 = sVar3 - local_80;
      puVar5 = std::min<unsigned_long>(&local_d0,&local_d8);
      local_d0 = *puVar5;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 1);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      local_e0 = sVar3 - local_88;
      puVar5 = std::min<unsigned_long>(&local_d0,&local_e0);
      local_d0 = *puVar5;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 2);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      local_e8 = sVar3 - local_90;
      puVar5 = std::min<unsigned_long>(&local_d0,&local_e8);
      local_d0 = *puVar5;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 3);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      local_f0 = sVar3 - local_98;
      puVar5 = std::min<unsigned_long>(&local_d0,&local_f0);
      local_d0 = *puVar5;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8);
      puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
      puVar7 = puVar6 + local_80;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 1);
      puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
      puVar8 = puVar6 + local_88;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 2);
      puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
      puVar9 = puVar6 + local_90;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 3);
      puVar6 = std::initializer_list<unsigned_char>::begin(piVar2);
      puVar10 = puVar6 + local_98;
      local_28 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (local_68,local_78);
      local_30 = local_d0;
      local_20 = puVar10;
      local_18 = puVar9;
      local_10 = puVar8;
      local_8 = puVar7;
      if (((anonymous_namespace)::cpu_supports_avx512_bw & 1) == 0) {
        anon_unknown.dwarf_16ead9::presieve2_x86_sse2
                  (puVar7,puVar8,puVar9,puVar10,local_28,local_d0);
      }
      else {
        anon_unknown.dwarf_16ead9::presieve2_x86_avx512
                  (in_stack_00000378,in_stack_00000370,in_stack_00000368,in_stack_00000360,
                   in_stack_00000358,in_stack_00000350);
      }
      uVar1 = local_80;
      local_78 = local_d0 + local_78;
      lVar11 = local_80 + local_d0;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      uVar13 = local_88;
      local_80 = lVar11 * (ulong)(uVar1 < sVar3);
      lVar11 = local_88 + local_d0;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 1);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      uVar1 = local_90;
      local_88 = lVar11 * (ulong)(uVar13 < sVar3);
      lVar11 = local_90 + local_d0;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 2);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      uVar13 = local_98;
      local_90 = lVar11 * (ulong)(uVar1 < sVar3);
      lVar11 = local_98 + local_d0;
      piVar2 = Array<std::initializer_list<unsigned_char>,_16UL>::operator[]
                         ((Array<std::initializer_list<unsigned_char>,_16UL> *)
                          (anonymous_namespace)::preSieveTables,local_c8 + 3);
      sVar3 = std::initializer_list<unsigned_char>::size(piVar2);
      local_98 = lVar11 * (ulong)(uVar13 < sVar3);
    }
  }
  uVar12 = getMaxPrime();
  if (uVar1 <= uVar12) {
    local_f8 = local_70 / 0x1e;
    local_100 = Vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_68);
    local_108.array_[0] = 0xff;
    local_108.array_[1] = 0xef;
    local_108.array_[2] = 'w';
    local_108.array_[3] = '?';
    local_108.array_[4] = 0xdb;
    local_108.array_[5] = 0xed;
    local_108.array_[6] = 0x9e;
    local_108.array_[7] = 0xfc;
    for (local_110 = 0; uVar13 = local_f8 + local_110,
        sVar4 = Array<unsigned_char,_8UL>::size(&local_108), uVar13 < sVar4;
        local_110 = local_110 + 1) {
      puVar14 = Array<unsigned_char,_8UL>::operator[](&local_108,local_f8 + local_110);
      local_100[local_110] = *puVar14;
    }
  }
  return;
}

Assistant:

void PreSieve::preSieve(Vector<uint8_t>& sieve, uint64_t segmentLow)
{
  uint64_t offset = 0;
  uint64_t pos0, pos1, pos2, pos3;

  pos0 = (segmentLow % (preSieveTables[0].size() * 30)) / 30;
  pos1 = (segmentLow % (preSieveTables[1].size() * 30)) / 30;
  pos2 = (segmentLow % (preSieveTables[2].size() * 30)) / 30;
  pos3 = (segmentLow % (preSieveTables[3].size() * 30)) / 30;

  // PreSieve algo 1
  while (offset < sieve.size())
  {
    uint64_t bytesToCopy = sieve.size() - offset;

    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[0].size() - pos0));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[1].size() - pos1));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[2].size() - pos2));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[3].size() - pos3));

    presieve1(&*(preSieveTables[0].begin() + pos0),
              &*(preSieveTables[1].begin() + pos1),
              &*(preSieveTables[2].begin() + pos2),
              &*(preSieveTables[3].begin() + pos3),
              &sieve[offset],
              bytesToCopy);

    offset += bytesToCopy;

    pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[0].size());
    pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[1].size());
    pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[2].size());
    pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[3].size());
  }

  // PreSieve algo 2
  for (std::size_t i = 4; i < preSieveTables.size(); i += 4)
  {
    offset = 0;

    pos0 = (segmentLow % (preSieveTables[i+0].size() * 30)) / 30;
    pos1 = (segmentLow % (preSieveTables[i+1].size() * 30)) / 30;
    pos2 = (segmentLow % (preSieveTables[i+2].size() * 30)) / 30;
    pos3 = (segmentLow % (preSieveTables[i+3].size() * 30)) / 30;

    while (offset < sieve.size())
    {
      uint64_t bytesToCopy = sieve.size() - offset;

      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+0].size() - pos0));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+1].size() - pos1));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+2].size() - pos2));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+3].size() - pos3));

      presieve2(&*(preSieveTables[i+0].begin() + pos0),
                &*(preSieveTables[i+1].begin() + pos1),
                &*(preSieveTables[i+2].begin() + pos2),
                &*(preSieveTables[i+3].begin() + pos3),
                &sieve[offset],
                bytesToCopy);

      offset += bytesToCopy;

      pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[i+0].size());
      pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[i+1].size());
      pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[i+2].size());
      pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[i+3].size());
    }
  }

  // Pre-sieving removes the primes <= 163. We
  // have to undo that work and reset these bits
  // to 1 (but 49 = 7 * 7 is not a prime).
  if (segmentLow <= getMaxPrime())
  {
    uint64_t i = segmentLow / 30;
    uint8_t* sieveArray = sieve.data();
    Array<uint8_t, 8> primeBits = { 0xff, 0xef, 0x77, 0x3f, 0xdb, 0xed, 0x9e, 0xfc };

    ASSERT(sieve.capacity() >= primeBits.size());
    for (std::size_t j = 0; i + j < primeBits.size(); j++)
      sieveArray[j] = primeBits[i + j];
  }
}